

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::cpp::anon_unknown_0::IntTypeName
                   (string *__return_storage_ptr__,Options *options,string *type)

{
  string *type_local;
  Options *options_local;
  
  std::operator+(__return_storage_ptr__,type,"_t");
  return __return_storage_ptr__;
}

Assistant:

std::string IntTypeName(const Options& options, const std::string& type) {
  return type + "_t";
}